

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSGetterName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,BytesMode bytes_mode,bool drop_list)

{
  int iVar1;
  BytesMode extraout_EDX;
  BytesMode extraout_EDX_00;
  BytesMode bytes_mode_00;
  string suffix;
  _Alloc_hider in_stack_ffffffffffffffa8;
  _anonymous_namespace_ local_48 [16];
  undefined1 local_38 [32];
  
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,(GeneratorOptions *)0x1,field,SUB41(bytes_mode,0),
                     drop_list,SUB81(in_stack_ffffffffffffffa8._M_p,0));
  bytes_mode_00 = extraout_EDX;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_38._0_8_ = FieldDescriptor::TypeOnceInit;
    in_stack_ffffffffffffffa8._M_p = (pointer)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_38,
               (FieldDescriptor **)&stack0xffffffffffffffa8);
    bytes_mode_00 = extraout_EDX_00;
  }
  if (*(int *)(this + 0x38) == 0xc) {
    JSByteGetterSuffix_abi_cxx11_
              ((string *)local_38,(_anonymous_namespace_ *)((ulong)options & 0xffffffff),
               bytes_mode_00);
    if (local_38._8_8_ != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffa8,"_as",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)in_stack_ffffffffffffffa8._M_p);
      if ((_anonymous_namespace_ *)in_stack_ffffffffffffffa8._M_p != local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p);
      }
    }
    if ((undefined1 *)local_38._0_8_ != local_38 + 0x10) {
      operator_delete((void *)local_38._0_8_);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if ((iVar1 != 0) &&
     (iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__), iVar1 != 0)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSGetterName(const GeneratorOptions& options,
                         const FieldDescriptor* field,
                         BytesMode bytes_mode = BYTES_DEFAULT,
                         bool drop_list = false) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ true,
                             /* is_map = */ false, drop_list);
  if (field->type() == FieldDescriptor::TYPE_BYTES) {
    std::string suffix = JSByteGetterSuffix(bytes_mode);
    if (!suffix.empty()) {
      name += "_as" + suffix;
    }
  }
  if (name == "Extension" || name == "JsPbMessageId") {
    // Avoid conflicts with base-class names.
    name += "$";
  }
  return name;
}